

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall google::protobuf::DescriptorPool::Tables::AddFile(Tables *this,FileDescriptor *file)

{
  bool bVar1;
  value_type local_30;
  char *local_28;
  FileDescriptor *local_20;
  FileDescriptor *file_local;
  Tables *this_local;
  
  local_20 = file;
  file_local = (FileDescriptor *)this;
  FileDescriptor::name_abi_cxx11_(file);
  local_28 = (char *)std::__cxx11::string::c_str();
  bVar1 = InsertIfNotPresent<google::protobuf::hash_map<char_const*,google::protobuf::FileDescriptor_const*,google::protobuf::hash<char_const*>,google::protobuf::streq>,char_const*,google::protobuf::FileDescriptor_const*>
                    (&this->files_by_name_,&local_28,&local_20);
  if (bVar1) {
    FileDescriptor::name_abi_cxx11_(local_20);
    local_30 = (value_type)std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (&this->files_after_checkpoint_,&local_30);
  }
  return bVar1;
}

Assistant:

bool DescriptorPool::Tables::AddFile(const FileDescriptor* file) {
  if (InsertIfNotPresent(&files_by_name_, file->name().c_str(), file)) {
    files_after_checkpoint_.push_back(file->name().c_str());
    return true;
  } else {
    return false;
  }
}